

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O1

aom_codec_err_t update_encoder_cfg(aom_codec_alg_priv_t_conflict *ctx)

{
  AV1_COMP *pAVar1;
  aom_internal_error_info *paVar2;
  bool bVar3;
  aom_codec_err_t extraout_EAX;
  int iVar4;
  aom_codec_err_t aVar5;
  AV1EncoderConfig *oxcf;
  AV1_PRIMARY *pAVar6;
  long lVar7;
  AV1_COMP *cpi_lap;
  _Bool is_sb_size_changed;
  _Bool local_41;
  aom_codec_alg_priv_t_conflict *local_40;
  AV1EncoderConfig *local_38;
  
  oxcf = &ctx->oxcf;
  set_encoder_config(oxcf,&ctx->cfg,&ctx->extra_cfg);
  av1_check_fpmt_config(ctx->ppi,oxcf);
  local_41 = false;
  local_38 = oxcf;
  av1_change_config_seq(ctx->ppi,oxcf,&local_41);
  pAVar6 = ctx->ppi;
  bVar3 = 0 < pAVar6->num_fp_contexts;
  aVar5 = extraout_EAX;
  local_40 = ctx;
  if (0 < pAVar6->num_fp_contexts) {
    lVar7 = 0;
    do {
      pAVar1 = pAVar6->parallel_cpi[lVar7];
      paVar2 = (pAVar1->common).error;
      iVar4 = _setjmp((__jmp_buf_tag *)paVar2->jmp);
      if (iVar4 == 0) {
        paVar2->setjmp = 1;
        av1_change_config(pAVar1,local_38,local_41);
        paVar2->setjmp = 0;
        oxcf = (AV1EncoderConfig *)((ulong)oxcf & 0xffffffff);
      }
      else {
        paVar2->setjmp = 0;
        oxcf = (AV1EncoderConfig *)(ulong)paVar2->error_code;
      }
      aVar5 = (aom_codec_err_t)oxcf;
      if (iVar4 != 0) break;
      lVar7 = lVar7 + 1;
      pAVar6 = local_40->ppi;
      bVar3 = lVar7 < pAVar6->num_fp_contexts;
    } while (lVar7 < pAVar6->num_fp_contexts);
  }
  if (!bVar3) {
    pAVar1 = local_40->ppi->cpi_lap;
    if (pAVar1 != (AV1_COMP *)0x0) {
      paVar2 = (pAVar1->common).error;
      iVar4 = _setjmp((__jmp_buf_tag *)paVar2->jmp);
      if (iVar4 != 0) {
        paVar2->setjmp = 0;
        return paVar2->error_code;
      }
      paVar2->setjmp = 1;
      av1_change_config(pAVar1,local_38,local_41);
      paVar2->setjmp = 0;
    }
    aVar5 = AOM_CODEC_OK;
  }
  return aVar5;
}

Assistant:

static aom_codec_err_t update_encoder_cfg(aom_codec_alg_priv_t *ctx) {
  set_encoder_config(&ctx->oxcf, &ctx->cfg, &ctx->extra_cfg);
  av1_check_fpmt_config(ctx->ppi, &ctx->oxcf);
  bool is_sb_size_changed = false;
  av1_change_config_seq(ctx->ppi, &ctx->oxcf, &is_sb_size_changed);
  for (int i = 0; i < ctx->ppi->num_fp_contexts; i++) {
    AV1_COMP *const cpi = ctx->ppi->parallel_cpi[i];
    struct aom_internal_error_info *const error = cpi->common.error;
    if (setjmp(error->jmp)) {
      error->setjmp = 0;
      return error->error_code;
    }
    error->setjmp = 1;
    av1_change_config(cpi, &ctx->oxcf, is_sb_size_changed);
    error->setjmp = 0;
  }
  if (ctx->ppi->cpi_lap != NULL) {
    AV1_COMP *const cpi_lap = ctx->ppi->cpi_lap;
    struct aom_internal_error_info *const error = cpi_lap->common.error;
    if (setjmp(error->jmp)) {
      error->setjmp = 0;
      return error->error_code;
    }
    error->setjmp = 1;
    av1_change_config(cpi_lap, &ctx->oxcf, is_sb_size_changed);
    error->setjmp = 0;
  }
  return AOM_CODEC_OK;
}